

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::TestTextureCube::TestTextureCube
          (TestTextureCube *this,TextureFormat *format,int size)

{
  CubeFace face;
  int iVar1;
  TextureFormat *format_00;
  long lVar2;
  long lVar3;
  TextureFormatInfo formatInfo;
  TextureFormatInfo local_70;
  
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTextureCube_00cf2de8;
  tcu::TextureCube::TextureCube(&this->m_texture,format,size);
  lVar2 = 0;
  while( true ) {
    iVar1 = (*(this->super_TestTexture)._vptr_TestTexture[2])(this);
    if (iVar1 <= lVar2) break;
    lVar3 = 0;
    do {
      face = *(CubeFace *)((long)&tcuFaceMapping + lVar3);
      tcu::TextureCube::allocLevel(&this->m_texture,face,(int)lVar2);
      format_00 = (TextureFormat *)
                  ((this->m_texture).m_access[face].
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar2);
      tcu::getTextureFormatInfo(&local_70,format_00);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)format_00,&local_70.valueMin,&local_70.valueMax);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x18);
    lVar2 = lVar2 + 1;
  }
  return;
}

Assistant:

TestTextureCube::TestTextureCube (const tcu::TextureFormat& format, int size)
	: TestTexture	(format, size, size, 1)
	, m_texture		(format, size)
{
	for (int levelNdx = 0; levelNdx < getNumLevels(); levelNdx++)
	{
		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
		{
			m_texture.allocLevel(tcuFaceMapping[faceNdx], levelNdx);
			TestTexture::fillWithGradient(m_texture.getLevelFace(levelNdx, tcuFaceMapping[faceNdx]));
		}
	}
}